

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_dc_top_predictor_4x16_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  ulong uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  int iVar5;
  undefined1 auVar6 [16];
  
  uVar1 = *(ulong *)above;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2._12_2_ = (short)(uVar1 >> 0x30);
  auVar3._8_2_ = (short)(uVar1 >> 0x20);
  auVar3._0_8_ = uVar1;
  auVar3._10_4_ = auVar2._10_4_;
  auVar4._6_8_ = 0;
  auVar4._0_6_ = auVar3._8_6_;
  auVar6 = ZEXT416((auVar2._10_4_ >> 0x10) +
                   (int)CONCAT82(SUB148(auVar4 << 0x40,6),(short)(uVar1 >> 0x10)) +
                   auVar3._8_4_ + (uint)(ushort)uVar1 + 2 >> 2);
  auVar6 = pshuflw(auVar6,auVar6,0);
  iVar5 = 0x10;
  do {
    *(long *)dst = auVar6._0_8_;
    dst = dst + stride;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

static inline void highbd_dc_top_predictor(uint16_t *dst, ptrdiff_t stride,
                                           int bw, int bh,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  int i, r, expected_dc, sum = 0;
  (void)left;
  (void)bd;

  for (i = 0; i < bw; i++) sum += above[i];
  expected_dc = (sum + (bw >> 1)) / bw;

  for (r = 0; r < bh; r++) {
    aom_memset16(dst, expected_dc, bw);
    dst += stride;
  }
}